

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

VariableData *
AddFunctionUpvalue(ExpressionContext *ctx,SynBase *source,FunctionData *function,VariableData *data)

{
  uint uVar1;
  ScopeData *pSVar2;
  bool bVar3;
  int iVar4;
  UpvalueData **ppUVar5;
  TypeBase *pTVar6;
  _func_int *p_Var7;
  TypeRef *pTVar8;
  VariableData *pVVar9;
  undefined4 extraout_var;
  VariableData *pVVar11;
  undefined4 extraout_var_00;
  VariableData *pVVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int **pp_Var13;
  IntrusiveList<MemberHandle> *this;
  uint uVar14;
  InplaceStr suffix;
  InplaceStr suffix_00;
  InplaceStr IVar15;
  UpvalueData *upvalue;
  UpvalueData *local_38;
  MemberHandle *pMVar10;
  
  ppUVar5 = SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::find
                      (&function->upvalueVariableMap,(VariableData **)&stack0xffffffffffffff90);
  if (ppUVar5 == (UpvalueData **)0x0) {
    pTVar6 = function->contextType;
    if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x12)) {
      pTVar6 = (TypeBase *)0x0;
    }
    if (pTVar6 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0xff7,
                    "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
                   );
    }
    pp_Var13 = pTVar6[1]._vptr_TypeBase;
    if ((pp_Var13 == (_func_int **)0x0) || (*(int *)(pp_Var13 + 1) != 0x18)) {
      pp_Var13 = (_func_int **)0x0;
    }
    if (pp_Var13 == (_func_int **)0x0) {
      __assert_fail("classType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0xffb,
                    "VariableData *AddFunctionUpvalue(ExpressionContext &, SynBase *, FunctionData *, VariableData *)"
                   );
    }
    pSVar2 = ctx->scope;
    ctx->scope = (ScopeData *)pp_Var13[0xc];
    bVar3 = SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
                      (&function->upvalueNameSet,&data->name->name);
    uVar14 = 0;
    if ((bVar3) && (p_Var7 = pp_Var13[0xd], uVar14 = 0, p_Var7 != (_func_int *)0x0)) {
      uVar14 = 0;
      do {
        uVar14 = uVar14 + 1;
        p_Var7 = *(_func_int **)(p_Var7 + 0x18);
      } while (p_Var7 != (_func_int *)0x0);
    }
    pTVar8 = ExpressionContext::GetReferenceType(ctx,data->type);
    IVar15.end = "";
    IVar15.begin = "target";
    IVar15 = GetFunctionContextMemberName(ctx,data->name->name,IVar15,uVar14);
    uVar1 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar1 + 1;
    pVVar9 = anon_unknown.dwarf_11255e::AllocateClassMember
                       (ctx,source,0,&pTVar8->super_TypeBase,IVar15,SUB41(uVar1,0),(uint)data);
    this = (IntrusiveList<MemberHandle> *)(pp_Var13 + 0xd);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var,iVar4);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar9;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    pTVar8 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
    suffix.end = "";
    suffix.begin = "nextUpvalue";
    IVar15 = GetFunctionContextMemberName(ctx,data->name->name,suffix,uVar14);
    uVar1 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar1 + 1;
    pVVar11 = anon_unknown.dwarf_11255e::AllocateClassMember
                        (ctx,source,0,&pTVar8->super_TypeBase,IVar15,SUB41(uVar1,0),(uint)data);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var_00,iVar4);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar11;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    uVar1 = data->alignment;
    pTVar6 = data->type;
    suffix_00.end = "";
    suffix_00.begin = "copy";
    IVar15 = GetFunctionContextMemberName(ctx,data->name->name,suffix_00,uVar14);
    uVar14 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar14 + 1;
    pVVar12 = anon_unknown.dwarf_11255e::AllocateClassMember
                        (ctx,source,uVar1,pTVar6,IVar15,SUB41(uVar14,0),(uint)data);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    pMVar10 = (MemberHandle *)CONCAT44(extraout_var_01,iVar4);
    pMVar10->source = (SynBase *)0x0;
    pMVar10->variable = pVVar12;
    pMVar10->initializer = (SynBase *)0x0;
    pMVar10->next = (MemberHandle *)0x0;
    pMVar10->listed = false;
    IntrusiveList<MemberHandle>::push_back(this,pMVar10);
    ctx->scope = pSVar2;
    data->usedAsExternal = true;
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    local_38 = (UpvalueData *)CONCAT44(extraout_var_02,iVar4);
    local_38->variable = data;
    local_38->target = pVVar9;
    local_38->nextUpvalue = pVVar11;
    local_38->copy = pVVar12;
    local_38->next = (UpvalueData *)0x0;
    local_38->listed = false;
    IntrusiveList<UpvalueData>::push_back(&function->upvalues,local_38);
    SmallDenseMap<VariableData_*,_UpvalueData_*,_VariableDataHasher,_2U>::insert
              (&function->upvalueVariableMap,(VariableData **)&stack0xffffffffffffff90,&local_38);
    SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::insert
              (&function->upvalueNameSet,&data->name->name);
  }
  else {
    pVVar9 = (*ppUVar5)->target;
  }
  return pVVar9;
}

Assistant:

VariableData* AddFunctionUpvalue(ExpressionContext &ctx, SynBase *source, FunctionData *function, VariableData *data)
{
	if(UpvalueData **prev = function->upvalueVariableMap.find(data))
		return (*prev)->target;

	TypeRef *refType = getType<TypeRef>(function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	ScopeData *currScope = ctx.scope;

	ctx.scope = classType->typeScope;

	unsigned index = 0;

	if(function->upvalueNameSet.contains(data->name->name))
		index = classType->members.size();

	// Pointer to target variable
	VariableData *target = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(data->type), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("target"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, target, NULL));

	// Pointer to next upvalue
	VariableData *nextUpvalue = AllocateClassMember(ctx, source, 0, ctx.GetReferenceType(ctx.typeVoid), GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("nextUpvalue"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, nextUpvalue, NULL));

	// Copy of the data
	VariableData *copy = AllocateClassMember(ctx, source, data->alignment, data->type, GetFunctionContextMemberName(ctx, data->name->name, InplaceStr("copy"), index), true, ctx.uniqueVariableId++);

	classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, copy, NULL));

	ctx.scope = currScope;

	data->usedAsExternal = true;

	UpvalueData *upvalue = new (ctx.get<UpvalueData>()) UpvalueData(data, target, nextUpvalue, copy);

	function->upvalues.push_back(upvalue);

	function->upvalueVariableMap.insert(data, upvalue);
	function->upvalueNameSet.insert(data->name->name);

	return target;
}